

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool __thiscall
absl::numbers_internal::safe_strto32_base
          (numbers_internal *this,string_view text,int32_t *value,int base)

{
  string_view text_00;
  bool bVar1;
  int base_local;
  int32_t *value_local;
  string_view text_local;
  
  text_00.length_ = (size_type)text.ptr_;
  text_00.ptr_ = (char *)this;
  bVar1 = anon_unknown_0::safe_int_internal<int>(text_00,(int *)text.length_,(int)value);
  return bVar1;
}

Assistant:

bool safe_strto32_base(absl::string_view text, int32_t* value, int base) {
  return safe_int_internal<int32_t>(text, value, base);
}